

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O1

bool RigidBodyDynamics::Math::LinSolveGaussElimPivot(MatrixNd *A,VectorNd *b,VectorNd *x)

{
  ulong uVar1;
  double *pdVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  undefined1 auVar6 [16];
  void *pvVar7;
  ostream *poVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ActualDstType actualDst;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  void *pvVar18;
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  VectorNd px;
  long local_60;
  DenseStorage<double,__1,__1,_1,_0> local_40;
  
  lVar16 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (0 < lVar16) {
    memset((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,0,
           lVar16 << 3);
  }
  uVar1 = (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  uVar17 = (uint)uVar1;
  pvVar7 = operator_new__((uVar1 & 0xffffffff) << 3);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            (&local_40,(DenseStorage<double,__1,__1,_1,_0> *)x);
  auVar6 = _DAT_00188220;
  if (uVar17 != 0) {
    uVar14 = uVar1 & 0xffffffff;
    lVar16 = uVar14 - 1;
    auVar20._8_4_ = (int)lVar16;
    auVar20._0_8_ = lVar16;
    auVar20._12_4_ = (int)((ulong)lVar16 >> 0x20);
    uVar9 = 0;
    auVar20 = auVar20 ^ _DAT_00188220;
    auVar22 = _DAT_00188210;
    do {
      auVar23 = auVar22 ^ auVar6;
      if ((bool)(~(auVar23._4_4_ == auVar20._4_4_ && auVar20._0_4_ < auVar23._0_4_ ||
                  auVar20._4_4_ < auVar23._4_4_) & 1)) {
        *(ulong *)((long)pvVar7 + uVar9 * 8) = uVar9;
      }
      if ((auVar23._12_4_ != auVar20._12_4_ || auVar23._8_4_ <= auVar20._8_4_) &&
          auVar23._12_4_ <= auVar20._12_4_) {
        *(ulong *)((long)pvVar7 + uVar9 * 8 + 8) = uVar9 + 1;
      }
      uVar9 = uVar9 + 2;
      lVar16 = auVar22._8_8_;
      auVar22._0_8_ = auVar22._0_8_ + 2;
      auVar22._8_8_ = lVar16 + 2;
    } while ((uVar14 + 1 & 0xfffffffffffffffe) != uVar9);
    local_60 = 1;
    uVar9 = 0;
    pvVar18 = pvVar7;
    do {
      lVar16 = (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows;
      pdVar2 = (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      dVar19 = ABS(pdVar2[uVar9 + *(long *)((long)pvVar7 + uVar9 * 8) * lVar16]);
      uVar10 = 0;
      do {
        lVar3 = *(long *)((long)pvVar18 + uVar10 * 8);
        dVar21 = ABS(pdVar2[uVar9 + lVar3 * lVar16]);
        if (dVar19 < dVar21) {
          uVar15 = *(uint *)((long)pvVar7 + uVar9 * 8);
          *(long *)((long)pvVar7 + uVar9 * 8) = lVar3;
          *(ulong *)((long)pvVar18 + uVar10 * 8) = (ulong)uVar15;
          dVar19 = dVar21;
        }
        uVar10 = uVar10 + 1;
      } while (uVar14 != uVar10);
      uVar10 = uVar9 + 1;
      lVar16 = local_60;
      if (uVar10 < (uVar1 & 0xffffffff)) {
        do {
          if (ABS((A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                  m_data[(A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                         m_storage.m_rows * *(long *)((long)pvVar7 + uVar9 * 8) + uVar9]) <=
              2.220446049250313e-16) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Error: pivoting failed for matrix A = ",0x26);
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x78);
            std::ostream::put(-0x78);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"A = ",4);
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x78);
            std::ostream::put(-0x78);
            poVar8 = (ostream *)std::ostream::flush();
            poVar8 = Eigen::operator<<(poVar8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                               *)A);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"b = ",4);
            poVar8 = Eigen::operator<<((ostream *)&std::cerr,
                                       (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)b);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
          }
          pdVar2 = (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                   m_data;
          lVar3 = (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                  m_rows;
          lVar11 = *(long *)((long)pvVar7 + uVar9 * 8) * lVar3;
          dVar19 = pdVar2[lVar11 + lVar16];
          dVar21 = pdVar2[lVar11 + uVar9];
          pdVar4 = (b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          pdVar4[lVar16] = pdVar4[lVar16] - pdVar4[uVar9] * (dVar19 / dVar21);
          uVar12 = 0;
          do {
            lVar11 = *(long *)((long)pvVar18 + uVar12 * 8) * lVar3;
            pdVar2[lVar11 + lVar16] =
                 pdVar2[lVar11 + lVar16] - pdVar2[lVar11 + uVar9] * (dVar19 / dVar21);
            uVar12 = uVar12 + 1;
          } while (uVar14 != uVar12);
          lVar16 = lVar16 + 1;
        } while ((uint)lVar16 != uVar17);
      }
      local_60 = local_60 + 1;
      pvVar18 = (void *)((long)pvVar18 + 8);
      uVar14 = uVar14 - 1;
      uVar9 = uVar10;
    } while (uVar10 != (uVar1 & 0xffffffff));
  }
  pdVar2 = (b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  pdVar4 = (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  lVar16 = (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  iVar13 = 0;
  uVar9 = uVar1 & 0xffffffff;
  do {
    uVar15 = (uint)uVar9 - 1;
    uVar14 = (ulong)uVar15;
    if ((uint)uVar9 < uVar17) {
      lVar3 = (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
      ;
      pdVar5 = (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      dVar19 = local_40.m_data[uVar14];
      lVar11 = 0;
      do {
        dVar19 = dVar19 + pdVar5[uVar14 + *(long *)((long)pvVar7 + lVar11 * 8 + uVar9 * 8) * lVar3]
                          * local_40.m_data[uVar9 + lVar11];
        local_40.m_data[uVar14] = dVar19;
        lVar11 = lVar11 + 1;
      } while (iVar13 != (int)lVar11);
    }
    local_40.m_data[uVar14] =
         (pdVar2[uVar14] - local_40.m_data[uVar14]) /
         pdVar4[*(long *)((long)pvVar7 + uVar14 * 8) * lVar16 + uVar14];
    iVar13 = iVar13 + 1;
    uVar9 = (ulong)uVar15;
  } while (uVar15 != 0);
  if (uVar17 != 0) {
    pdVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    uVar9 = 0;
    do {
      pdVar2[*(long *)((long)pvVar7 + uVar9 * 8)] = local_40.m_data[uVar9];
      uVar9 = uVar9 + 1;
    } while ((uVar1 & 0xffffffff) != uVar9);
  }
  operator_delete__(pvVar7);
  free(local_40.m_data);
  return true;
}

Assistant:

RBDL_DLLAPI bool LinSolveGaussElimPivot (MatrixNd A, VectorNd b, VectorNd &x) {
  x = VectorNd::Zero(x.size());

  // We can only solve quadratic systems
  assert (A.rows() == A.cols());

  unsigned int n = A.rows();
  unsigned int pi;

  // the pivots
  size_t *pivot = new size_t[n];

  // temporary result vector which contains the pivoted result
  VectorNd px(x);

  unsigned int i,j,k;

  for (i = 0; i < n; i++)
    pivot[i] = i;

  for (j = 0; j < n; j++) {
    pi = j;
    Scalar pv = fabs (A(j,pivot[j]));

    // LOG << "j = " << j << " pv = " << pv << std::endl;
    // find the pivot
    for (k = j; k < n; k++) {
      Scalar pt = fabs (A(j,pivot[k]));
      if (pt > pv) {
        pv = pt;
        pi = k;
        unsigned int p_swap = pivot[j];
        pivot[j] = pivot[pi];
        pivot[pi] = p_swap;
        //	LOG << "swap " << j << " with " << pi << std::endl;
        //	LOG << "j = " << j << " pv = " << pv << std::endl;
      }
    }

    for (i = j + 1; i < n; i++) {
      if (Scalar(fabs(A(j,pivot[j]))) <= Scalar(std::numeric_limits<double>::epsilon())) {
        std::cerr << "Error: pivoting failed for matrix A = " << std::endl;
        std::cerr << "A = " << std::endl << A << std::endl;
        std::cerr << "b = " << b << std::endl;
      }
      //		assert (fabs(A(j,pivot[j])) > std::numeric_limits<double>::epsilon());
      Scalar d = A(i,pivot[j])/A(j,pivot[j]);

      b[i] -= b[j] * d;

      for (k = j; k < n; k++) {
        A(i,pivot[k]) -= A(j,pivot[k]) * d;
      }
    }
  }

  // warning: i is an unsigned int, therefore a for loop of the 
  // form "for (i = n - 1; i >= 0; i--)" might end up in getting an invalid
  // value for i!
  i = n;
  do {
    i--;

    for (j = i + 1; j < n; j++) {
      px[i] += A(i,pivot[j]) * px[j];
    }
    px[i] = (b[i] - px[i]) / A(i,pivot[i]);

  } while (i > 0);

  // Unswapping
  for (i = 0; i < n; i++) {
    x[pivot[i]] = px[i];
  }

  /*
     LOG << "A = " << std::endl << A << std::endl;
     LOG << "b = " << b << std::endl;
     LOG << "x = " << x << std::endl;
     LOG << "pivot = " << pivot[0] << " " << pivot[1] << " " << pivot[2] << std::endl;
     std::cout << LogOutput.str() << std::endl;
     */

  delete[] pivot;

  return true;
}